

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAligned
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  void *ret;
  LogMessage *pLVar1;
  char *pcVar2;
  char *pcVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((n + 7 & 0xfffffffffffffff8) != n) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xd6);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: (internal::AlignUpTo8(n)) == (n): ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  pcVar2 = this->ptr_;
  pcVar3 = this->limit_;
  if (pcVar3 < pcVar2) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xd7);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: (limit_) >= (ptr_): ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
    pcVar2 = this->ptr_;
    pcVar3 = this->limit_;
  }
  if ((ulong)((long)pcVar3 - (long)pcVar2) < n) {
    pcVar2 = (char *)AllocateAlignedFallback(this,n,policy);
  }
  else {
    this->ptr_ = pcVar2 + n;
  }
  return pcVar2;
}

Assistant:

void* AllocateAligned(size_t n, const AllocationPolicy* policy) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    GOOGLE_DCHECK_GE(limit_, ptr_);
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n))) {
      return AllocateAlignedFallback(n, policy);
    }
    return AllocateFromExisting(n);
  }